

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_slot_allocator_free(ma_slot_allocator *pAllocator,ma_uint64 slot)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  ma_result mVar4;
  ulong uVar5;
  bool bVar6;
  
  mVar4 = MA_INVALID_ARGS;
  if ((pAllocator != (ma_slot_allocator *)0x0) &&
     (uVar3 = (uint)(slot >> 5) & 0x7ffffff,
     uVar3 < ((pAllocator->capacity >> 5) + 1) - (uint)((pAllocator->capacity & 0x1f) == 0))) {
    bVar2 = (byte)slot & 0x1f;
    uVar5 = (ulong)(uVar3 << 2);
    do {
      if (pAllocator->count == 0) {
        return MA_INVALID_OPERATION;
      }
      uVar3 = *(uint *)((long)&pAllocator->pGroups->bitfield + uVar5);
      puVar1 = (uint *)((long)&pAllocator->pGroups->bitfield + uVar5);
      LOCK();
      bVar6 = uVar3 == *puVar1;
      if (bVar6) {
        *puVar1 = uVar3 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      }
      UNLOCK();
    } while (!bVar6);
    LOCK();
    pAllocator->count = pAllocator->count - 1;
    UNLOCK();
    mVar4 = MA_SUCCESS;
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_slot_allocator_free(ma_slot_allocator* pAllocator, ma_uint64 slot)
{
    ma_uint32 iGroup;
    ma_uint32 iBit;

    if (pAllocator == NULL) {
        return MA_INVALID_ARGS;
    }

    iGroup = (ma_uint32)((slot & 0xFFFFFFFF) >> 5);   /* slot / 32 */
    iBit   = (ma_uint32)((slot & 0xFFFFFFFF) & 31);   /* slot % 32 */

    if (iGroup >= ma_slot_allocator_group_capacity(pAllocator)) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(iBit < 32);   /* This must be true due to the logic we used to actually calculate it. */

    while (ma_atomic_load_32(&pAllocator->count) > 0) {
        /* CAS */
        ma_uint32 oldBitfield;
        ma_uint32 newBitfield;

        oldBitfield = ma_atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */
        newBitfield = oldBitfield & ~(1 << iBit);

        /* Debugging for checking for double-frees. */
        #if defined(MA_DEBUG_OUTPUT)
        {
            if ((oldBitfield & (1 << iBit)) == 0) {
                MA_ASSERT(MA_FALSE);    /* Double free detected.*/
            }
        }
        #endif

        if (ma_atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
            ma_atomic_fetch_sub_32(&pAllocator->count, 1);
            return MA_SUCCESS;
        }
    }

    /* Getting here means there are no allocations available for freeing. */
    return MA_INVALID_OPERATION;
}